

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

void spirv_cross::ParsedIR::sanitize_identifier
               (string *name,bool member,bool allow_reserved_prefixes)

{
  byte bVar1;
  bool bVar2;
  char *c;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  char *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar2 = is_valid_identifier((spirv_cross *)(name->_M_dataplus)._M_p,
                              (string *)name->_M_string_length);
  if (!bVar2) {
    ::std::__cxx11::string::find((char)name,0x28);
    ::std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
    if (local_40._M_string_length != 0) {
      _Var4._M_p = local_40._M_dataplus._M_p;
      if ((9 < (byte)(*local_40._M_dataplus._M_p - 0x30U)) ||
         (*local_40._M_dataplus._M_p = 0x5f, local_40._M_string_length != 0)) {
        _Var3._M_p = local_40._M_dataplus._M_p;
        do {
          bVar1 = *_Var3._M_p;
          if (((bVar1 != 0x5f) && (9 < (byte)(bVar1 - 0x30))) &&
             (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
            *_Var3._M_p = 0x5f;
          }
          _Var3._M_p = _Var3._M_p + 1;
        } while (_Var3._M_p != local_40._M_dataplus._M_p + local_40._M_string_length);
        if (local_40._M_string_length != 0) {
          bVar2 = false;
          _Var3._M_p = local_40._M_dataplus._M_p;
          do {
            bVar1 = *_Var3._M_p;
            if ((bool)(bVar2 & bVar1 == 0x5f)) {
              bVar2 = true;
            }
            else {
              if (_Var3._M_p != _Var4._M_p) {
                *_Var4._M_p = bVar1;
              }
              _Var4._M_p = _Var4._M_p + 1;
              bVar2 = bVar1 == 0x5f;
            }
            _Var3._M_p = _Var3._M_p + 1;
          } while (_Var3._M_p != local_40._M_dataplus._M_p + local_40._M_string_length);
        }
      }
      local_40._M_string_length = (long)_Var4._M_p - (long)local_40._M_dataplus._M_p;
      *_Var4._M_p = 0;
    }
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  bVar2 = is_reserved_identifier(name,member,allow_reserved_prefixes);
  if (bVar2) {
    bVar2 = is_reserved_prefix(name);
    __lhs = "_RESERVED_IDENTIFIER_FIXUP";
    if (bVar2) {
      __lhs = "_RESERVED_IDENTIFIER_FIXUP_";
    }
    ::std::operator+(&local_40,__lhs,name);
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void ParsedIR::sanitize_identifier(std::string &name, bool member, bool allow_reserved_prefixes)
{
	if (!is_valid_identifier(name))
		name = ensure_valid_identifier(name);
	if (is_reserved_identifier(name, member, allow_reserved_prefixes))
		name = make_unreserved_identifier(name);
}